

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void rsg::(anonymous_namespace)::convertExecValueTempl<float,int>
               (ExecConstValueAccess src,ExecValueAccess dst)

{
  int iVar1;
  int ndx;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  do {
    fVar3 = src.m_value[lVar2].floatVal;
    if (fVar3 == -INFINITY) {
      iVar1 = -0x80000000;
    }
    else if (fVar3 == INFINITY) {
      iVar1 = 0x7fffffff;
    }
    else {
      if (fVar3 <= 0.0) {
        fVar3 = ceilf(fVar3);
      }
      else {
        fVar3 = floorf(fVar3);
      }
      iVar1 = (int)fVar3;
    }
    dst.super_ConstStridedValueAccess<64>.m_value[lVar2].intVal = iVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

void convertExecValueTempl (ExecConstValueAccess src, ExecValueAccess dst)
{
	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		dst.as<DstType>(ndx) = convert<SrcType, DstType>(src.as<SrcType>(ndx));
}